

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::removeAnchor
          (QGraphicsAnchorLayoutPrivate *this,AnchorVertex *firstVertex,AnchorVertex *secondVertex)

{
  bool bVar1;
  bool bVar2;
  QGraphicsLayoutItem *this_00;
  ulong uVar3;
  long in_RDX;
  long in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar4;
  int i_1;
  int i;
  int refcount;
  bool keepSecondItem;
  bool keepFirstItem;
  QGraphicsAnchorLayout *q;
  QGraphicsLayoutItem *secondItem;
  QGraphicsLayoutItem *firstItem;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> v;
  QGraphicsLayoutItem **in_stack_fffffffffffffef8;
  AnchorVertex *in_stack_ffffffffffffff00;
  QGraphicsLayoutItem *pQVar5;
  AnchorVertex *in_stack_ffffffffffffff08;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff10;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *key;
  QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
  *in_stack_ffffffffffffff18;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *this_01;
  AnchorPoint local_c8;
  AnchorPoint local_c4;
  int local_c0;
  AnchorPoint local_84;
  AnchorVertex *local_80;
  int local_78;
  AnchorPoint local_6c;
  QGraphicsLayoutItem *local_68;
  QGraphicsLayoutItem *local_60;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_58;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> local_48;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_38;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsLayoutItem *)q_func(in_RDI);
  local_60 = *(QGraphicsLayoutItem **)(in_RSI + 8);
  local_68 = *(QGraphicsLayoutItem **)(in_RDX + 8);
  removeAnchor_helper(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00)
  ;
  bVar1 = false;
  bVar2 = false;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>::
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int,_true>
            ((pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)local_18);
  if (local_60 == this_00) {
    bVar1 = true;
  }
  else {
    for (local_c4 = AnchorLeft; (int)local_c4 < 6; local_c4 = local_c4 + AnchorHorizontalCenter) {
      local_6c = local_c4;
      std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>::
      pair<QGraphicsLayoutItem_*&,_Qt::AnchorPoint,_true>(&local_38,&local_60,&local_6c);
      pVar4 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
              ::value(in_stack_ffffffffffffff18,
                      (pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)in_stack_ffffffffffffff10);
      local_80 = pVar4.first;
      local_78 = pVar4.second;
      local_28.first = local_80;
      local_28.second = local_78;
      std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>::operator=
                ((pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)local_18,&local_28);
      if ((AnchorVertex *)local_18._0_8_ != (AnchorVertex *)0x0) {
        if ((local_c4 == AnchorHorizontalCenter) || (local_c4 == AnchorVerticalCenter)) {
          local_c0 = 2;
        }
        else {
          local_c0 = 1;
        }
        if (local_c0 < (int)local_18._8_4_) {
          bVar1 = true;
          break;
        }
      }
    }
  }
  if (local_68 == this_00) {
    bVar2 = true;
  }
  else {
    for (local_c8 = AnchorLeft; (int)local_c8 < 6; local_c8 = local_c8 + AnchorHorizontalCenter) {
      key = (pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *)&in_RDI->m_vertexList;
      local_84 = local_c8;
      this_01 = &local_58;
      std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>::
      pair<QGraphicsLayoutItem_*&,_Qt::AnchorPoint,_true>(this_01,&local_68,&local_84);
      pVar4 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
              ::value((QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
                       *)this_01,key);
      local_48.first = pVar4.first;
      local_48.second = pVar4.second;
      std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>::operator=
                ((pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> *)local_18,&local_48);
      if ((AnchorVertex *)local_18._0_8_ != (AnchorVertex *)0x0) {
        if ((local_c8 == AnchorHorizontalCenter) || (local_c8 == AnchorVerticalCenter)) {
          local_c0 = 2;
        }
        else {
          local_c0 = 1;
        }
        if (local_c0 < (int)local_18._8_4_) {
          bVar2 = true;
          break;
        }
      }
    }
  }
  if (!bVar1) {
    pQVar5 = this_00;
    uVar3 = QListSpecialMethodsBase<QGraphicsLayoutItem*>::indexOf<QGraphicsLayoutItem*>
                      ((QListSpecialMethodsBase<QGraphicsLayoutItem_*> *)in_stack_ffffffffffffff00,
                       in_stack_fffffffffffffef8,0x938242);
    (*pQVar5->_vptr_QGraphicsLayoutItem[0xb])(pQVar5,uVar3 & 0xffffffff);
  }
  if (!bVar2) {
    pQVar5 = this_00;
    uVar3 = QListSpecialMethodsBase<QGraphicsLayoutItem*>::indexOf<QGraphicsLayoutItem*>
                      ((QListSpecialMethodsBase<QGraphicsLayoutItem_*> *)this_00,
                       in_stack_fffffffffffffef8,0x93827d);
    (*pQVar5->_vptr_QGraphicsLayoutItem[0xb])(pQVar5,uVar3 & 0xffffffff);
  }
  (*this_00->_vptr_QGraphicsLayoutItem[7])();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeAnchor(AnchorVertex *firstVertex,
                                                AnchorVertex *secondVertex)
{
    Q_Q(QGraphicsAnchorLayout);

    // Save references to items while it's safe to assume the vertices exist
    QGraphicsLayoutItem *firstItem = firstVertex->m_item;
    QGraphicsLayoutItem *secondItem = secondVertex->m_item;

    // Delete the anchor (may trigger deletion of center vertices)
    removeAnchor_helper(firstVertex, secondVertex);

    // Ensure no dangling pointer is left behind
    firstVertex = secondVertex = nullptr;

    // Checking if the item stays in the layout or not
    bool keepFirstItem = false;
    bool keepSecondItem = false;

    std::pair<AnchorVertex *, int> v;
    int refcount = -1;

    if (firstItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(firstItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepFirstItem = true;
                    break;
                }
            }
        }
    } else
        keepFirstItem = true;

    if (secondItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(secondItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepSecondItem = true;
                    break;
                }
            }
        }
    } else
        keepSecondItem = true;

    if (!keepFirstItem)
        q->removeAt(items.indexOf(firstItem));

    if (!keepSecondItem)
        q->removeAt(items.indexOf(secondItem));

    // Removing anchors invalidates the layout
    q->invalidate();
}